

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlcat.c
# Opt level: O2

unsigned_long strlcat(char *dst,char *src,size_t siz)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  bool bVar8;
  
  sVar7 = siz;
  for (pcVar1 = dst;
      (bVar8 = sVar7 != 0, sVar7 = sVar7 - 1, pcVar3 = dst + siz, bVar8 &&
      (pcVar3 = pcVar1, *pcVar1 != '\0')); pcVar1 = pcVar1 + 1) {
  }
  lVar6 = (long)pcVar3 - (long)dst;
  lVar4 = siz - lVar6;
  if (lVar4 == 0) {
    sVar2 = strlen(src);
  }
  else {
    for (sVar2 = 0; src[sVar2] != '\0'; sVar2 = sVar2 + 1) {
      lVar5 = 1;
      if (lVar4 != 1) {
        *pcVar3 = src[sVar2];
        pcVar3 = pcVar3 + 1;
        lVar5 = lVar4 + -1;
      }
      lVar4 = lVar5;
    }
    *pcVar3 = '\0';
  }
  return sVar2 + lVar6;
}

Assistant:

size_t
strlcat(char *dst, const char *src, size_t siz)
{
	char *d = dst;
	const char *s = src;
	size_t n = siz;
	size_t dlen;

	/* Find the end of dst and adjust bytes left but don't go past end */
	while (n-- != 0 && *d != '\0')
		d++;
	dlen = d - dst;
	n = siz - dlen;

	if (n == 0)
		return(dlen + strlen(s));
	while (*s != '\0') {
		if (n != 1) {
			*d++ = *s;
			n--;
		}
		s++;
	}
	*d = '\0';

	return(dlen + (s - src));	/* count does not include NUL */
}